

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O0

wchar_t keymacro_delete(EditLine *el,wchar_t *key)

{
  wchar_t *key_local;
  EditLine *el_local;
  
  if (*key == L'\0') {
    fprintf((FILE *)el->el_errfile,"keymacro_delete: Null extended-key not allowed.\n");
    el_local._4_4_ = L'\xffffffff';
  }
  else if ((el->el_keymacro).map == (keymacro_node_t *)0x0) {
    el_local._4_4_ = L'\0';
  }
  else {
    node__delete(el,&(el->el_keymacro).map,key);
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
keymacro_delete(EditLine *el, const wchar_t *key)
{

	if (key[0] == '\0') {
		(void) fprintf(el->el_errfile,
		    "keymacro_delete: Null extended-key not allowed.\n");
		return -1;
	}
	if (el->el_keymacro.map == NULL)
		return 0;

	(void) node__delete(el, &el->el_keymacro.map, key);
	return 0;
}